

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void double_conversion::FixupMultiply10
               (int estimated_power,bool is_even,int *decimal_point,Bignum *numerator,
               Bignum *denominator,Bignum *delta_minus,Bignum *delta_plus)

{
  bool bVar1;
  int iVar2;
  int *in_RDX;
  byte in_SIL;
  int in_EDI;
  Bignum *in_R8;
  Bignum *in_R9;
  undefined1 uVar3;
  Bignum *unaff_retaddr;
  Bignum *in_stack_00000008;
  bool in_range;
  Bignum *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined3 in_stack_fffffffffffffff8;
  
  if ((in_SIL & 1) == 0) {
    iVar2 = Bignum::PlusCompare(in_stack_00000008,unaff_retaddr,
                                (Bignum *)
                                (CONCAT44(in_EDI,CONCAT13(in_SIL,in_stack_fffffffffffffff8)) &
                                0xffffffff01ffffff));
    uVar3 = 0 < iVar2;
  }
  else {
    iVar2 = Bignum::PlusCompare(in_stack_00000008,unaff_retaddr,
                                (Bignum *)
                                (CONCAT44(in_EDI,CONCAT13(in_SIL,in_stack_fffffffffffffff8)) &
                                0xffffffff01ffffff));
    uVar3 = -1 < iVar2;
  }
  if ((bool)uVar3 == false) {
    *in_RDX = in_EDI;
    Bignum::Times10((Bignum *)0x386ecf);
    bVar1 = Bignum::Equal((Bignum *)CONCAT17(uVar3,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
    if (bVar1) {
      Bignum::Times10((Bignum *)0x386eee);
      Bignum::AssignBignum(in_R8,in_R9);
    }
    else {
      Bignum::Times10((Bignum *)0x386f09);
      Bignum::Times10((Bignum *)0x386f13);
    }
  }
  else {
    *in_RDX = in_EDI + 1;
  }
  return;
}

Assistant:

static void FixupMultiply10(int estimated_power, bool is_even,
                            int* decimal_point,
                            Bignum* numerator, Bignum* denominator,
                            Bignum* delta_minus, Bignum* delta_plus) {
  bool in_range;
  if (is_even) {
    // For IEEE doubles half-way cases (in decimal system numbers ending with 5)
    // are rounded to the closest floating-point number with even significand.
    in_range = Bignum::PlusCompare(*numerator, *delta_plus, *denominator) >= 0;
  } else {
    in_range = Bignum::PlusCompare(*numerator, *delta_plus, *denominator) > 0;
  }
  if (in_range) {
    // Since numerator + delta_plus >= denominator we already have
    // 1 <= numerator/denominator < 10. Simply update the estimated_power.
    *decimal_point = estimated_power + 1;
  } else {
    *decimal_point = estimated_power;
    numerator->Times10();
    if (Bignum::Equal(*delta_minus, *delta_plus)) {
      delta_minus->Times10();
      delta_plus->AssignBignum(*delta_minus);
    } else {
      delta_minus->Times10();
      delta_plus->Times10();
    }
  }
}